

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

bool __thiscall
DListBase<Js::RecyclableObject_*,_RealCount>::Append<Memory::HeapAllocator>
          (DListBase<Js::RecyclableObject_*,_RealCount> *this,HeapAllocator *allocator,
          RecyclableObject **data)

{
  DListNodeBase<Js::RecyclableObject_*> *pDVar1;
  anon_union_8_3_7fb8a913_for_next aVar2;
  HeapAllocator *alloc;
  anon_union_8_3_7fb8a913_for_next *paVar3;
  undefined1 local_40 [8];
  TrackAllocData data_1;
  
  local_40 = (undefined1  [8])&DListNode<Js::RecyclableObject*>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_26dcec;
  data_1.filename._0_4_ = 0xf0;
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_40);
  paVar3 = (anon_union_8_3_7fb8a913_for_next *)new<Memory::HeapAllocator>(0x18,alloc,0x2f6726);
  paVar3[2].base = (DListNodeBase<Js::RecyclableObject_*> *)*data;
  pDVar1 = (this->super_DListNodeBase<Js::RecyclableObject_*>).prev.base;
  paVar3[1].base = pDVar1;
  aVar2 = pDVar1->next;
  paVar3->base = (DListNodeBase<Js::RecyclableObject_*> *)aVar2;
  *(anon_union_8_3_7fb8a913_for_next **)((long)aVar2 + 8) = paVar3;
  (pDVar1->next).base = (DListNodeBase<Js::RecyclableObject_*> *)paVar3;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Append(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            DListBase::InsertNodeAfter(this->Prev(), newNode);
            this->IncrementCount();
            return true;
        }
        return false;
    }